

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O0

int Gia_ManCheckUnate(Gia_Man_t *p,int iCiId,int iCoId)

{
  int iVar1;
  int ObjId;
  Gia_Obj_t *pGVar2;
  uint local_4c;
  Gia_Obj_t *pCoObj;
  int CoObjId;
  int CiObjId;
  int Res;
  int iCoId_local;
  int iCiId_local;
  Gia_Man_t *p_local;
  
  pGVar2 = Gia_ManCi(p,iCiId);
  iVar1 = Gia_ObjId(p,pGVar2);
  pGVar2 = Gia_ManCo(p,iCoId);
  ObjId = Gia_ObjId(p,pGVar2);
  pGVar2 = Gia_ManCo(p,iCoId);
  Gia_ManIncrementTravId(p);
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrentId(p,iVar1);
  Gia_ManIncrementTravId(p);
  Gia_ManIncrementTravId(p);
  iVar1 = Gia_ObjFaninId0(pGVar2,ObjId);
  local_4c = Gia_ManCheckUnate_rec(p,iVar1);
  if (((local_4c == 1) || (local_4c == 2)) && (iVar1 = Gia_ObjFaninC0(pGVar2), iVar1 != 0)) {
    local_4c = local_4c ^ 3;
  }
  return local_4c;
}

Assistant:

int Gia_ManCheckUnate( Gia_Man_t * p, int iCiId, int iCoId )
{
    int Res;
    int CiObjId = Gia_ObjId(p, Gia_ManCi(p, iCiId));
    int CoObjId = Gia_ObjId(p, Gia_ManCo(p, iCoId));
    Gia_Obj_t * pCoObj = Gia_ManCo(p, iCoId);
    Gia_ManIncrementTravId( p ); // Co does not depend on Ci.
    Gia_ManIncrementTravId( p ); // Co is pos-unate in Ci
    Gia_ObjSetTravIdCurrentId( p, CiObjId );
    Gia_ManIncrementTravId( p ); // Co is neg-unate in Ci
    Gia_ManIncrementTravId( p ); // Co is not unate in Ci
    Res = Gia_ManCheckUnate_rec( p, Gia_ObjFaninId0(pCoObj, CoObjId) );
    return ((Res == 1 || Res == 2) && Gia_ObjFaninC0(pCoObj)) ? Res ^ 3 : Res;
}